

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
* soul::StructuralParser::parseTopLevelDeclarations
            (vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
             *__return_storage_ptr__,Allocator *allocator,CodeLocation *code,
            Namespace *parentNamespace)

{
  const_iterator __first;
  ulong uVar1;
  StructuralParser p;
  StructuralParser local_c0;
  
  StructuralParser(&local_c0,allocator,code,&parentNamespace->super_ModuleBase);
  uVar1 = (long)(parentNamespace->subModules).
                super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(parentNamespace->subModules).
                super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  parseTopLevelDecls(&local_c0,parentNamespace);
  if ((int)(uVar1 >> 3) == 0) {
    std::
    vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
    ::vector(__return_storage_ptr__,&parentNamespace->subModules);
  }
  else {
    std::
    vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
    ::vector(__return_storage_ptr__,&parentNamespace->subModules);
    __first._M_current =
         (__return_storage_ptr__->
         super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    std::
    vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
    ::erase(__return_storage_ptr__,__first,
            (pool_ref<soul::AST::ModuleBase> *)
            ((long)&(__first._M_current)->object + ((long)(uVar1 * 0x20000000) >> 0x1d)));
  }
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::~Tokeniser(&local_c0.super_SOULTokeniser);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<pool_ref<AST::ModuleBase>> parseTopLevelDeclarations (AST::Allocator& allocator,
                                                                             CodeLocation code,
                                                                             AST::Namespace& parentNamespace)
    {
        StructuralParser p (allocator, code, parentNamespace);
        auto oldNumModules = static_cast<int> (parentNamespace.subModules.size());
        p.parseTopLevelDecls (parentNamespace);

        if (oldNumModules == 0)
            return parentNamespace.subModules;

        auto newModules = parentNamespace.subModules;
        newModules.erase (newModules.begin(), newModules.begin() + oldNumModules);
        return newModules;
    }